

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

void __thiscall
embree::XMLLoader::XMLLoader
          (XMLLoader *this,FileName *fileName,AffineSpace3fa *space,SharedState *state)

{
  FileName *this_00;
  _Rb_tree_header *p_Var1;
  Ref<embree::SceneGraph::Node> *child;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  AffineSpace3fa *xfm;
  bool bVar6;
  uint uVar7;
  undefined4 uVar8;
  FILE *__stream;
  size_t sVar9;
  GroupNode *this_01;
  ulong uVar10;
  TransformNode *this_02;
  runtime_error *this_03;
  ulong uVar11;
  Ref<embree::XML> xml;
  undefined1 local_a0 [32];
  string local_80;
  undefined8 local_60;
  AffineSpace3fa *local_58;
  string local_50;
  
  FileName::FileName(&this->path);
  this->binFile = (FILE *)0x0;
  this_00 = &this->binFileName;
  FileName::FileName(this_00);
  this->binFileSize = 0;
  this->state = state;
  this->currentNodeID = 0;
  p_Var1 = &(this->id2node)._M_t._M_impl.super__Rb_tree_header;
  (this->id2node)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->id2node)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->id2node)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->id2node)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->id2node)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->id2material)._M_t._M_impl.super__Rb_tree_header;
  (this->id2material)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->id2material)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->id2material)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->id2material)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  child = &this->root;
  (this->id2material)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->root).ptr = (Node *)0x0;
  local_60 = this_00;
  FileName::path((FileName *)local_a0,fileName);
  std::__cxx11::string::operator=((string *)this,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string((string *)(local_a0 + 0x20),".bin",(allocator *)&xml);
  FileName::setExt((FileName *)local_a0,fileName,(string *)(local_a0 + 0x20));
  std::__cxx11::string::operator=((string *)this_00,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(local_a0 + 0x20));
  __stream = fopen((this->binFileName).filename._M_dataplus._M_p,"rb");
  this->binFile = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    std::__cxx11::string::string((string *)(local_a0 + 0x20),".bin",(allocator *)&xml);
    FileName::addExt((FileName *)local_a0,fileName,(string *)(local_a0 + 0x20));
    std::__cxx11::string::operator=((string *)this_00,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)(local_a0 + 0x20));
    __stream = fopen((this->binFileName).filename._M_dataplus._M_p,"rb");
    this->binFile = (FILE *)__stream;
    if (__stream != (FILE *)0x0) goto LAB_0017eec3;
  }
  else {
LAB_0017eec3:
    fseek(__stream,0,2);
    sVar9 = ftell((FILE *)this->binFile);
    this->binFileSize = sVar9;
    fseek((FILE *)this->binFile,0,0);
  }
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)local_a0);
  parseXML((embree *)&xml,fileName,&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  bVar6 = std::operator==(&(xml.ptr)->name,"scene");
  local_58 = space;
  if (bVar6) {
    this_01 = (GroupNode *)::operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_01,0);
    (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
    for (uVar11 = 0;
        uVar11 < (ulong)((long)((xml.ptr)->children).
                               super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)((xml.ptr)->children).
                               super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar11 = uVar11 + 1)
    {
      loadNode((XMLLoader *)local_a0,(Ref<embree::XML> *)this);
      SceneGraph::GroupNode::add(this_01,(Ref<embree::SceneGraph::Node> *)local_a0);
      if ((Node *)local_a0._0_8_ != (Node *)0x0) {
        (**(code **)(*(long *)local_a0._0_8_ + 0x18))();
      }
    }
    (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
    if (child->ptr != (Node *)0x0) {
      (*(child->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    child->ptr = (Node *)this_01;
    uVar7 = (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])(this_01);
    uVar10 = (ulong)uVar7;
  }
  else {
    bVar6 = std::operator==(&(xml.ptr)->name,"BGFscene");
    if (!bVar6) {
      this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
      ParseLocation::str_abi_cxx11_((string *)(local_a0 + 0x20),&(xml.ptr)->loc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_a0 + 0x20),": invalid scene tag");
      std::runtime_error::runtime_error(this_03,(string *)local_a0);
      __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (uVar11 = 0;
        uVar10 = (long)((xml.ptr)->children).
                       super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)((xml.ptr)->children).
                       super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3, uVar11 < uVar10;
        uVar11 = uVar11 + 1) {
      loadBGFNode((XMLLoader *)local_a0,(Ref<embree::XML> *)this);
      if (child->ptr != (Node *)0x0) {
        (*(child->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      child->ptr = (Node *)local_a0._0_8_;
    }
  }
  xfm = local_58;
  auVar2._4_4_ = -(uint)((local_58->l).vx.field_0.m128[1] == 0.0);
  auVar2._0_4_ = -(uint)((local_58->l).vx.field_0.m128[0] == 1.0);
  auVar2._8_4_ = -(uint)((local_58->l).vx.field_0.m128[2] == 0.0);
  auVar2._12_4_ = -(uint)((local_58->l).vx.field_0.m128[3] == 0.0);
  uVar8 = movmskps((int)uVar10,auVar2);
  if ((~(byte)uVar8 & 7) == 0) {
    auVar3._4_4_ = -(uint)((local_58->l).vy.field_0.m128[1] == 1.0);
    auVar3._0_4_ = -(uint)((local_58->l).vy.field_0.m128[0] == 0.0);
    auVar3._8_4_ = -(uint)((local_58->l).vy.field_0.m128[2] == 0.0);
    auVar3._12_4_ = -(uint)((local_58->l).vy.field_0.m128[3] == 0.0);
    uVar8 = movmskps(CONCAT31((int3)((uint)uVar8 >> 8),~(byte)uVar8),auVar3);
    if ((~(byte)uVar8 & 7) == 0) {
      auVar4._4_4_ = -(uint)((local_58->l).vz.field_0.m128[1] == 0.0);
      auVar4._0_4_ = -(uint)((local_58->l).vz.field_0.m128[0] == 0.0);
      auVar4._8_4_ = -(uint)((local_58->l).vz.field_0.m128[2] == 1.0);
      auVar4._12_4_ = -(uint)((local_58->l).vz.field_0.m128[3] == 0.0);
      uVar8 = movmskps(CONCAT31((int3)((uint)uVar8 >> 8),~(byte)uVar8),auVar4);
      if ((~(byte)uVar8 & 7) == 0) {
        auVar5._4_4_ = -(uint)((local_58->p).field_0.m128[1] == 0.0);
        auVar5._0_4_ = -(uint)((local_58->p).field_0.m128[0] == 0.0);
        auVar5._8_4_ = -(uint)((local_58->p).field_0.m128[2] == 0.0);
        auVar5._12_4_ = -(uint)((local_58->p).field_0.m128[3] == 0.0);
        uVar8 = movmskps(CONCAT31((int3)((uint)uVar8 >> 8),~(byte)uVar8),auVar5);
        if ((~(byte)uVar8 & 7) == 0) goto LAB_0017f0e5;
      }
    }
  }
  this_02 = (TransformNode *)SceneGraph::TransformNode::operator_new(0xa0);
  SceneGraph::TransformNode::TransformNode(this_02,xfm,child);
  (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
  if (child->ptr != (Node *)0x0) {
    (*(child->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  child->ptr = (Node *)this_02;
LAB_0017f0e5:
  if (xml.ptr != (XML *)0x0) {
    (*((xml.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  return;
}

Assistant:

XMLLoader::XMLLoader(const FileName& fileName, const AffineSpace3fa& space, SharedState& state)
    : binFile(nullptr), binFileSize(0), state(state), currentNodeID(0)
  {
    path = fileName.path();
    binFileName = fileName.setExt(".bin");
    binFile = fopen(binFileName.c_str(),"rb");
    if (!binFile) {
      binFileName = fileName.addExt(".bin");
      binFile = fopen(binFileName.c_str(),"rb");
    }
    if (binFile) {
      fseek(binFile, 0L, SEEK_END);
      binFileSize = ftell(binFile);
      fseek(binFile, 0L, SEEK_SET);
    }


    Ref<XML> xml = parseXML(fileName);
    if (xml->name == "scene") 
    {
      Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
      for (size_t i=0; i<xml->size(); i++) { 
        group->add(loadNode(xml->children[i]));
      }
      root = group.cast<SceneGraph::Node>();
    }
    else if (xml->name == "BGFscene") 
    {
      Ref<SceneGraph::Node> last = nullptr;
      for (size_t i=0; i<xml->size(); i++) { 
        root = loadBGFNode(xml->children[i]);
      }
    }
    else 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid scene tag");

    if (space == AffineSpace3fa(one)) 
      return;
    
    root = new SceneGraph::TransformNode(space,root);
  }